

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

int gdsRecordToText(char *recIn)

{
  pointer *this;
  pointer *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  uint local_150;
  uint local_14c;
  uint j_1;
  uint j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  bitset<8UL> local_e8;
  bitset<8UL> bitsIn1;
  bitset<8UL> bitsIn0;
  undefined1 local_d0 [4];
  int i;
  undefined4 local_b0;
  char local_99;
  string local_98 [7];
  uint8_t dataType;
  string keyName;
  string words;
  vector<double,_std::allocator<double>_> B8Real;
  vector<int,_std::allocator<int>_> integer;
  bitset<16UL> bitarr;
  uint32_t GDSKey;
  char *recIn_local;
  
  this = &integer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  std::bitset<16UL>::bitset((bitset<16UL> *)this);
  this_00 = &B8Real.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this_00);
  this_01 = (vector<double,_std::allocator<double>_> *)((long)&words.field_2 + 8);
  std::vector<double,_std::allocator<double>_>::vector(this_01);
  std::__cxx11::string::string((string *)(keyName.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_98);
  iVar1 = GDSdistill(recIn,(uint32_t *)((long)&bitarr.super__Base_bitset<1UL>._M_w + 4),
                     (bitset<16UL> *)this,(vector<int,_std::allocator<int>_> *)this_00,this_01,
                     (string *)(keyName.field_2._M_local_buf + 8));
  if (iVar1 == 1) {
    recIn_local._4_4_ = 1;
  }
  else {
    local_99 = bitarr.super__Base_bitset<1UL>._M_w._4_1_;
    GDSkey2ASCII_abi_cxx11_((string *)local_d0,bitarr.super__Base_bitset<1UL>._M_w._4_4_);
    std::__cxx11::string::operator=(local_98,(string *)local_d0);
    std::__cxx11::string::~string((string *)local_d0);
    iVar1 = std::__cxx11::string::compare((char *)local_98);
    if (iVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Key not found: 0x");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,bitarr.super__Base_bitset<1UL>._M_w._4_4_)
      ;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      recIn_local._4_4_ = 1;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"[");
      poVar2 = std::operator<<(poVar2,local_98);
      std::operator<<(poVar2,"]");
      if (local_99 == '\0') {
        std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      }
      else if (local_99 == '\x01') {
        std::bitset<8UL>::bitset(&bitsIn1,(long)recIn[4]);
        std::bitset<8UL>::bitset(&local_e8,(long)recIn[5]);
        poVar2 = std::operator<<((ostream *)&std::cout,":{");
        poVar2 = std::operator<<(poVar2,"0b");
        std::bitset<8ul>::to_string_abi_cxx11_(&local_108,(bitset<8ul> *)&bitsIn1);
        poVar2 = std::operator<<(poVar2,(string *)&local_108);
        std::bitset<8ul>::to_string_abi_cxx11_
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&j_1,
                   (bitset<8ul> *)&local_e8);
        std::operator+(&local_128," 0b",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&j_1);
        poVar2 = std::operator<<(poVar2,(string *)&local_128);
        poVar2 = std::operator<<(poVar2,"}");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&j_1);
        std::__cxx11::string::~string((string *)&local_108);
      }
      else if ((local_99 == '\x02') || (local_99 == '\x03')) {
        std::operator<<((ostream *)&std::cout,":{");
        for (local_14c = 0;
            sVar3 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)
                               &B8Real.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage), local_14c < sVar3;
            local_14c = local_14c + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &B8Real.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(ulong)local_14c);
          std::ostream::operator<<((ostream *)&std::cout,*pvVar4);
          sVar3 = std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)
                             &B8Real.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
          if ((ulong)local_14c < sVar3 - 1) {
            std::operator<<((ostream *)&std::cout,", ");
          }
        }
        poVar2 = std::operator<<((ostream *)&std::cout,"}");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        if (local_99 == '\x04') {
          poVar2 = std::operator<<((ostream *)&std::cout,"Unsupported 4 byte real variable.");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          recIn_local._4_4_ = 1;
          goto LAB_00111d75;
        }
        if (local_99 == '\x05') {
          std::operator<<((ostream *)&std::cout,":{");
          std::ios_base::precision
                    ((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),0xc);
          for (local_150 = 0;
              sVar3 = std::vector<double,_std::allocator<double>_>::size
                                ((vector<double,_std::allocator<double>_> *)
                                 ((long)&words.field_2 + 8)), local_150 < sVar3;
              local_150 = local_150 + 1) {
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                ((long)&words.field_2 + 8),(ulong)local_150);
            std::ostream::operator<<((ostream *)&std::cout,*pvVar5);
            sVar3 = std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)((long)&words.field_2 + 8)
                              );
            if ((ulong)local_150 < sVar3 - 1) {
              std::operator<<((ostream *)&std::cout,", ");
            }
          }
          poVar2 = std::operator<<((ostream *)&std::cout,"}");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
        else {
          if (local_99 != '\x06') {
            poVar2 = std::operator<<((ostream *)&std::cout,"Smoke detected.");
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            recIn_local._4_4_ = 1;
            goto LAB_00111d75;
          }
          poVar2 = std::operator<<((ostream *)&std::cout,":{");
          poVar2 = std::operator<<(poVar2,(string *)(keyName.field_2._M_local_buf + 8));
          poVar2 = std::operator<<(poVar2,"}");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
      }
      recIn_local._4_4_ = 0;
    }
  }
LAB_00111d75:
  local_b0 = 1;
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)(keyName.field_2._M_local_buf + 8));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)((long)&words.field_2 + 8));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &B8Real.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return recIn_local._4_4_;
}

Assistant:

int gdsRecordToText(char *recIn)
{
  uint32_t GDSKey;
  bitset<16> bitarr;
  vector<int> integer;
  vector<double> B8Real;
  string words;
  string keyName;

  uint8_t dataType;

  if (GDSdistill(recIn, GDSKey, bitarr, integer, B8Real, words) == 1) {
    return 1;
  }
  dataType = GDSKey;

  keyName = GDSkey2ASCII(GDSKey);

  if (!keyName.compare("\0")) {
    cout << "Key not found: 0x" << hex << GDSKey << dec << endl;
    return 1;
  }

  cout << "[" << keyName << "]";

  if (dataType == 0) {
    // no data
    cout << endl;
  } else if (dataType == 1) {
    // bit array
    int i = 4;
    bitset<8> bitsIn0(recIn[i++]);
    bitset<8> bitsIn1(recIn[i]);

    cout << ":{"
         << "0b" << bitsIn0.to_string() << " 0b" + bitsIn1.to_string() << "}"
         << endl;
  } else if (dataType == 2 || dataType == 3) {
    // signed integers

    cout << ":{";
    for (unsigned int j = 0; j < integer.size(); j++) {
      cout << integer[j];
      if (j < integer.size() - 1) {
        cout << ", ";
      }
    }
    cout << "}" << endl;
  } else if (dataType == 4) {
    // 4 byte real (NOT USED)
    cout << "Unsupported 4 byte real variable." << endl;
    return 1;
  } else if (dataType == 5) {
    // 8 byte real

    cout << ":{";
    cout.precision(12);
    for (unsigned int j = 0; j < B8Real.size(); j++) {
      cout << B8Real[j];
      if (j < B8Real.size() - 1) {
        cout << ", ";
      }
    }
    cout << "}" << endl;
  } else if (dataType == 6) {
    // ASCII string

    cout << ":{" << words << "}" << endl;
  } else {
    cout << "Smoke detected." << endl;
    return 1;
  }

  return 0;
}